

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_bzip2.c
# Opt level: O0

int bzip2_reader_init(archive_read_filter *self)

{
  void *__ptr;
  void *__ptr_00;
  private_data *state;
  void *out_block;
  archive_read_filter *self_local;
  
  self->code = 2;
  self->name = "bzip2";
  __ptr = calloc(0x68,1);
  __ptr_00 = malloc(0x10000);
  if ((__ptr == (void *)0x0) || (__ptr_00 == (void *)0x0)) {
    archive_set_error(&self->archive->archive,0xc,"Can\'t allocate data for bzip2 decompression");
    free(__ptr_00);
    free(__ptr);
    self_local._4_4_ = -0x1e;
  }
  else {
    self->data = __ptr;
    *(undefined8 *)((long)__ptr + 0x58) = 0x10000;
    *(void **)((long)__ptr + 0x50) = __ptr_00;
    self->vtable = &bzip2_reader_vtable;
    self_local._4_4_ = 0;
  }
  return self_local._4_4_;
}

Assistant:

static int
bzip2_reader_init(struct archive_read_filter *self)
{
	static const size_t out_block_size = 64 * 1024;
	void *out_block;
	struct private_data *state;

	self->code = ARCHIVE_FILTER_BZIP2;
	self->name = "bzip2";

	state = (struct private_data *)calloc(sizeof(*state), 1);
	out_block = (unsigned char *)malloc(out_block_size);
	if (state == NULL || out_block == NULL) {
		archive_set_error(&self->archive->archive, ENOMEM,
		    "Can't allocate data for bzip2 decompression");
		free(out_block);
		free(state);
		return (ARCHIVE_FATAL);
	}

	self->data = state;
	state->out_block_size = out_block_size;
	state->out_block = out_block;
	self->vtable = &bzip2_reader_vtable;

	return (ARCHIVE_OK);
}